

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

u32string * __thiscall
test_parser::serialize_u32_abi_cxx11_
          (u32string *__return_storage_ptr__,test_parser *this,object *in_object)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  jessilib local_30 [32];
  
  (**(code **)((long)*this + 0x30))(local_30);
  jessilib::string_cast<char32_t,std::__cxx11::u8string>(__return_storage_ptr__,local_30,in_string);
  std::__cxx11::u8string::~u8string((u8string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::u32string serialize_u32(const object& in_object) override { return string_cast<char32_t>(serialize_u8(in_object)); }